

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
syntax_gtest_tests::syntax_tests::iu_GTestSyntaxTest_x_iutest_x_ExceptionValueNE_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_ExceptionValueNE_Test *this)

{
  bool bVar1;
  undefined4 *puVar2;
  Fixed *fixed;
  char *message;
  AssertionResult ar_3;
  int *e_3;
  AssertionResult iutest_ar_3;
  int x_3;
  AssertionResult ar_2;
  int *e_2;
  AssertionResult iutest_ar_2;
  int x_2;
  AssertionResult ar_1;
  int *e_1;
  AssertionResult iutest_ar_1;
  undefined1 local_240 [4];
  int x_1;
  Fixed local_210;
  AssertionResult ar;
  int *e;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  int x;
  iu_GTestSyntaxTest_x_iutest_x_ExceptionValueNE_Test *this_local;
  
  iutest_ar._36_4_ = 1;
  iutest::detail::AlwaysZero();
  iutest::AssertionSuccess();
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (bVar1) {
    bVar1 = iutest::detail::AlwaysTrue();
    if (bVar1) {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 2;
      __cxa_throw(puVar2,&int::typeinfo,0);
    }
    iutest::AssertionResult::operator<<
              ((AssertionResult *)local_40,
               (char (*) [81])
               "\nExpected: throw 2 throws an exception of type int.\n  Actual: it throws nothing.")
    ;
  }
  memset(&local_210,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_210);
  fixed = iutest::AssertionHelper::Fixed::operator<<(&local_210,iutest_ar._36_4_);
  message = iutest::AssertionResult::message((AssertionResult *)local_40);
  iutest::AssertionHelper::AssertionHelper
            ((AssertionHelper *)local_240,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
             ,0x20f,message,kFatalFailure);
  iutest::AssertionHelper::operator=((AssertionHelper *)local_240,fixed);
  iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_240);
  iutest::AssertionHelper::Fixed::~Fixed(&local_210);
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

TEST(GTestSyntaxTest, ExceptionValueNE)
{
    if( int x = 1 )
        ASSERT_THROW_VALUE_NE(throw 2, int, x) << x;
    if( int x = 1 )
        EXPECT_THROW_VALUE_NE(throw 2, int, x) << x;
    if( int x = 1 )
        INFORM_THROW_VALUE_NE(throw 2, int, x) << x;
    if( int x = 1 )
        ASSUME_THROW_VALUE_NE(throw 2, int, x) << x;
}